

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ValueFederateManager.cpp
# Opt level: O1

vector<int,_std::allocator<int>_> * __thiscall
helics::ValueFederateManager::queryUpdates
          (vector<int,_std::allocator<int>_> *__return_storage_ptr__,ValueFederateManager *this)

{
  iterator __position;
  int iVar1;
  Input *inp;
  Input *pIVar2;
  Input **ppIVar3;
  Input **ppIVar4;
  int iVar5;
  ulong uVar6;
  int ii;
  shared_handle inpHandle;
  int local_4c;
  shared_handle local_48;
  
  (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  gmlc::libguarded::
  shared_guarded_opt<gmlc::containers::DualStringMappedVector<helics::Input,_helics::InterfaceHandle,_(reference_stability)0,_5>,_std::mutex>
  ::lock_shared(&local_48,&this->inputs);
  local_4c = 0;
  if (((local_48.data)->dataStorage).csize == 0) {
    uVar6 = (ulong)((local_48.data)->dataStorage).bsize;
    ppIVar4 = ((local_48.data)->dataStorage).dataptr;
    if (uVar6 != 0x20) {
      ppIVar4 = ppIVar4 + ((local_48.data)->dataStorage).dataSlotIndex;
      pIVar2 = *ppIVar4 + uVar6;
      goto LAB_001fe272;
    }
    if (ppIVar4 == (Input **)0x0) {
      ppIVar4 = &gmlc::containers::
                 StableBlockVector<helics::Input,_5U,_std::allocator<helics::Input>_>::end::
                 emptyValue;
    }
    else {
      ppIVar4 = ppIVar4 + (long)((local_48.data)->dataStorage).dataSlotIndex + 1;
    }
  }
  else {
    ppIVar4 = ((local_48.data)->dataStorage).dataptr;
  }
  pIVar2 = *ppIVar4;
  uVar6 = 0;
LAB_001fe272:
  iVar1 = ((local_48.data)->dataStorage).bsize;
  ppIVar3 = ((local_48.data)->dataStorage).dataptr;
  if (iVar1 == 0x20) {
    if (ppIVar3 == (Input **)0x0) {
      ppIVar3 = &gmlc::containers::
                 StableBlockVector<helics::Input,_5U,_std::allocator<helics::Input>_>::end::
                 emptyValue;
    }
    else {
      ppIVar3 = ppIVar3 + (long)((local_48.data)->dataStorage).dataSlotIndex + 1;
    }
    iVar1 = 0;
  }
  else {
    ppIVar3 = ppIVar3 + ((local_48.data)->dataStorage).dataSlotIndex;
  }
  while ((iVar5 = (int)uVar6, iVar5 != iVar1 || (ppIVar4 != ppIVar3))) {
    if (pIVar2->hasUpdate == true) {
      __position._M_current =
           (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
           super__Vector_impl_data._M_finish;
      if (__position._M_current ==
          (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                  ((vector<int,std::allocator<int>> *)__return_storage_ptr__,__position,&local_4c);
      }
      else {
        *__position._M_current = local_4c;
        (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
        super__Vector_impl_data._M_finish = __position._M_current + 1;
      }
    }
    local_4c = local_4c + 1;
    uVar6 = (ulong)(iVar5 + 1U);
    if (iVar5 < 0x1f) {
      pIVar2 = pIVar2 + 1;
    }
    else {
      ppIVar4 = ppIVar4 + (ulong)(iVar5 - 0x1fU >> 5) + 1;
      uVar6 = (ulong)(iVar5 + 1U & 0x1f);
      pIVar2 = *ppIVar4 + uVar6;
    }
  }
  std::unique_lock<std::mutex>::~unique_lock(&local_48.m_handle_lock);
  return __return_storage_ptr__;
}

Assistant:

std::vector<int> ValueFederateManager::queryUpdates()
{
    std::vector<int> updates;
    auto inpHandle = inputs.lock_shared();
    int ii = 0;
    for (const auto& inp : *inpHandle) {
        if (inp.hasUpdate) {
            updates.push_back(ii);
        }
        ++ii;
    }
    return updates;
}